

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

bool __thiscall tinyusdz::primvar::PrimVar::is_scalar(PrimVar *this)

{
  bool bVar1;
  
  bVar1 = has_value(this);
  return bVar1 && (this->_ts)._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  (this->_ts)._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool is_scalar() const {
    return has_value() && _ts.empty();
  }